

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O2

string * __thiscall
picojson::_parse_number<boost::asio::buffers_iterator<boost::asio::const_buffer,char>>
          (string *__return_storage_ptr__,picojson *this,
          input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *in)

{
  uint uVar1;
  int iVar2;
  lconv *plVar3;
  FILE *__stream;
  FILE *__stream_00;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __stream_00 = (FILE *)this;
  do {
    while( true ) {
      iVar2 = input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::getc
                        ((input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *)
                         this,__stream_00);
      if (9 < iVar2 - 0x30U) break;
LAB_001839c2:
      __stream_00 = (FILE *)(ulong)(uint)(int)(char)iVar2;
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    uVar1 = iVar2 - 0x2b;
    if (0x3a < uVar1) {
LAB_001839e7:
      input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_>::ungetc
                ((input<boost::asio::buffers_iterator<boost::asio::const_buffer,_char>_> *)this,
                 (int)__stream_00,__stream);
      return __return_storage_ptr__;
    }
    if ((0x400000004000005U >> ((ulong)uVar1 & 0x3f) & 1) != 0) goto LAB_001839c2;
    if ((ulong)uVar1 != 3) goto LAB_001839e7;
    plVar3 = localeconv();
    __stream_00 = (FILE *)plVar3->decimal_point;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  } while( true );
}

Assistant:

inline std::string _parse_number(input<Iter>& in) {
    std::string num_str;
    while (1) {
      int ch = in.getc();
      if (('0' <= ch && ch <= '9') || ch == '+' || ch == '-'
          || ch == 'e' || ch == 'E') {
        num_str.push_back(ch);
      } else if (ch == '.') {
#if PICOJSON_USE_LOCALE
        num_str += localeconv()->decimal_point;
#else
        num_str.push_back('.');
#endif
      } else {
	in.ungetc();
	break;
      }
    }
    return num_str;
  }